

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::Pop(SQVM *this,SQInteger n)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  if (0 < n) {
    lVar2 = n;
  }
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    lVar1 = this->_top + -1;
    this->_top = lVar1;
    SQObjectPtr::Null((this->_stack)._vals + lVar1);
  }
  return;
}

Assistant:

void SQVM::Pop(SQInteger n) {
    for(SQInteger i = 0; i < n; i++){
        _stack[--_top].Null();
    }
}